

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

size_t __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<std::__cxx11::string_const,int>>>
::_find_key<std::__cxx11::string>
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<std::__cxx11::string_const,int>>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
          size_t hashval)

{
  char *pcVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  __m128i match;
  undefined1 auVar7 [16];
  probe_seq<16UL> seq;
  EqualElement<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  char cStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  char cStack_49;
  undefined1 local_48 [16];
  
  if (*(long *)this != 0) {
    raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::probe(&seq,(raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)this,hashval);
    auVar6 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
    auVar6 = pshuflw(auVar6,auVar6,0);
    uVar5 = auVar6._0_4_;
    local_48._4_4_ = uVar5;
    local_48._0_4_ = uVar5;
    local_48._8_4_ = uVar5;
    local_48._12_4_ = uVar5;
    while( true ) {
      pcVar1 = (char *)(*(long *)this + seq.offset_);
      local_58 = *pcVar1;
      cStack_57 = pcVar1[1];
      cStack_56 = pcVar1[2];
      cStack_55 = pcVar1[3];
      cStack_54 = pcVar1[4];
      cStack_53 = pcVar1[5];
      cStack_52 = pcVar1[6];
      cStack_51 = pcVar1[7];
      cStack_50 = pcVar1[8];
      cStack_4f = pcVar1[9];
      cStack_4e = pcVar1[10];
      cStack_4d = pcVar1[0xb];
      cStack_4c = pcVar1[0xc];
      cStack_4b = pcVar1[0xd];
      cStack_4a = pcVar1[0xe];
      cStack_49 = pcVar1[0xf];
      auVar6[0] = -(local_48[0] == local_58);
      auVar6[1] = -(local_48[1] == cStack_57);
      auVar6[2] = -(local_48[2] == cStack_56);
      auVar6[3] = -(local_48[3] == cStack_55);
      auVar6[4] = -(local_48[4] == cStack_54);
      auVar6[5] = -(local_48[5] == cStack_53);
      auVar6[6] = -(local_48[6] == cStack_52);
      auVar6[7] = -(local_48[7] == cStack_51);
      auVar6[8] = -(local_48[8] == cStack_50);
      auVar6[9] = -(local_48[9] == cStack_4f);
      auVar6[10] = -(local_48[10] == cStack_4e);
      auVar6[0xb] = -(local_48[0xb] == cStack_4d);
      auVar6[0xc] = -(local_48[0xc] == cStack_4c);
      auVar6[0xd] = -(local_48[0xd] == cStack_4b);
      auVar6[0xe] = -(local_48[0xe] == cStack_4a);
      auVar6[0xf] = -(local_48[0xf] == cStack_49);
      for (uVar4 = (uint)(ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                                 (ushort)(auVar6[0xf] >> 7) << 0xf); uVar4 != 0;
          uVar4 = uVar4 - 1 & uVar4) {
        uVar2 = 0;
        if (uVar4 != 0) {
          for (; (uVar4 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        local_68.rhs = key;
        local_68.eq = (key_equal *)(this + 0x30);
        bVar3 = DecomposePair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<std::__cxx11::string_const,int>>>::EqualElement<std::__cxx11::string>,std::pair<std::__cxx11::string_const,int>&>
                          (&local_68,
                           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                            *)((seq.offset_ + uVar2 & seq.mask_) * 0x28 + *(long *)(this + 8)));
        if (bVar3) {
          return uVar2 + seq.offset_ & seq.mask_;
        }
      }
      auVar7[0] = -(local_58 == -0x80);
      auVar7[1] = -(cStack_57 == -0x80);
      auVar7[2] = -(cStack_56 == -0x80);
      auVar7[3] = -(cStack_55 == -0x80);
      auVar7[4] = -(cStack_54 == -0x80);
      auVar7[5] = -(cStack_53 == -0x80);
      auVar7[6] = -(cStack_52 == -0x80);
      auVar7[7] = -(cStack_51 == -0x80);
      auVar7[8] = -(cStack_50 == -0x80);
      auVar7[9] = -(cStack_4f == -0x80);
      auVar7[10] = -(cStack_4e == -0x80);
      auVar7[0xb] = -(cStack_4d == -0x80);
      auVar7[0xc] = -(cStack_4c == -0x80);
      auVar7[0xd] = -(cStack_4b == -0x80);
      auVar7[0xe] = -(cStack_4a == -0x80);
      auVar7[0xf] = -(cStack_49 == -0x80);
      if ((((((((((((((((auVar7 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar7 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar7 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar7 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar7 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar7 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar7 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar7 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar7 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar7 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar7 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar7 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar7 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar7 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar7 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cStack_49 == -0x80)
      break;
      seq.index_ = seq.index_ + 0x10;
      seq.offset_ = seq.index_ + seq.offset_ & seq.mask_;
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t _find_key(const K& PHMAP_RESTRICT key, size_t hashval) {
        PHMAP_IF_CONSTEXPR (!std_alloc_t::value) {
            // ctrl_ could be nullptr
            if (!ctrl_)
                return (size_t)-1;
        }
        auto seq = probe(hashval);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            for (uint32_t i : g.Match((h2_t)H2(hashval))) {
                if (PHMAP_PREDICT_TRUE(PolicyTraits::apply(
                                          EqualElement<K>{key, eq_ref()},
                                          PolicyTraits::element(slots_ + seq.offset((size_t)i)))))
                    return seq.offset((size_t)i);
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) break;
            seq.next();
        }
        return (size_t)-1;
    }